

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::FixOptionsForField
          (Generator *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  ushort *puVar1;
  Descriptor *pDVar2;
  string_view descriptor_str;
  string_view python_dict_name;
  string_view python_dict_name_00;
  allocator<char> local_71;
  string field_name;
  string local_50;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  field_name._M_dataplus._M_p = (pointer)&field_name.field_2;
  field_name._M_string_length = 0;
  field_name.field_2._M_local_buf[0] = '\0';
  if ((field->field_0x1 & 8) == 0) {
    python_dict_name._M_str = "fields_by_name";
    python_dict_name._M_len = 0xe;
    FieldReferencingExpression_abi_cxx11_
              (&local_50,this,field->containing_type_,field,python_dict_name);
  }
  else {
    pDVar2 = FieldDescriptor::extension_scope(field);
    if (pDVar2 == (Descriptor *)0x0) {
      puVar1 = (ushort *)(field->all_names_).payload_;
      local_30._M_len = (size_t)*puVar1;
      local_30._M_str = (char *)((long)puVar1 + ~local_30._M_len);
      std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                ((string *)&local_50,&local_30,&local_71);
    }
    else {
      pDVar2 = FieldDescriptor::extension_scope(field);
      python_dict_name_00._M_str = "extensions_by_name";
      python_dict_name_00._M_len = 0x12;
      FieldReferencingExpression_abi_cxx11_(&local_50,this,pDVar2,field,python_dict_name_00);
    }
  }
  std::__cxx11::string::operator=((string *)&field_name,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  descriptor_str._M_str = field_name._M_dataplus._M_p;
  descriptor_str._M_len = field_name._M_string_length;
  PrintDescriptorOptionsFixingCode<google::protobuf::FieldDescriptor>
            (this,field,proto,descriptor_str);
  std::__cxx11::string::~string((string *)&field_name);
  return;
}

Assistant:

void Generator::FixOptionsForField(const FieldDescriptor& field,
                                   const FieldDescriptorProto& proto) const {
  std::string field_name;
  if (field.is_extension()) {
    if (field.extension_scope() == nullptr) {
      // Top level extensions.
      field_name = std::string(field.name());
    } else {
      field_name = FieldReferencingExpression(field.extension_scope(), field,
                                              "extensions_by_name");
    }
  } else {
    field_name = FieldReferencingExpression(field.containing_type(), field,
                                            "fields_by_name");
  }
  PrintDescriptorOptionsFixingCode(field, proto, field_name);
}